

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_decompress_chunk
              (png_structrp png_ptr,png_uint_32 chunklength,png_uint_32 prefix_size,
              png_alloc_size_t *newlength,int terminate)

{
  png_alloc_size_t pVar1;
  png_bytep ppVar2;
  int iVar3;
  png_alloc_size_t size;
  png_bytep old_ptr;
  png_bytep text;
  png_alloc_size_t buffer_size;
  png_alloc_size_t new_size;
  png_uint_32 lzsize;
  int ret;
  png_alloc_size_t limit;
  png_alloc_size_t *ppStack_28;
  int terminate_local;
  png_alloc_size_t *newlength_local;
  png_uint_32 prefix_size_local;
  png_uint_32 chunklength_local;
  png_structrp png_ptr_local;
  
  _lzsize = 0xffffffffffffffff;
  if ((png_ptr->user_chunk_malloc_max != 0) &&
     (png_ptr->user_chunk_malloc_max != 0xffffffffffffffff)) {
    _lzsize = png_ptr->user_chunk_malloc_max;
  }
  limit._4_4_ = terminate;
  ppStack_28 = newlength;
  newlength_local._0_4_ = prefix_size;
  newlength_local._4_4_ = chunklength;
  _prefix_size_local = png_ptr;
  if (_lzsize < prefix_size + (terminate != 0)) {
    png_zstream_error(png_ptr,-4);
    png_ptr_local._4_4_ = -4;
  }
  else {
    _lzsize = _lzsize - (prefix_size + (terminate != 0));
    if (_lzsize < *newlength) {
      *newlength = _lzsize;
    }
    new_size._4_4_ = png_inflate_claim(png_ptr,png_ptr->chunk_name);
    if (new_size._4_4_ == 0) {
      new_size._0_4_ = newlength_local._4_4_ - (png_uint_32)newlength_local;
      new_size._4_4_ =
           png_inflate(_prefix_size_local,_prefix_size_local->chunk_name,1,
                       _prefix_size_local->read_buffer + (png_uint_32)newlength_local,
                       (png_uint_32p)&new_size,(png_bytep)0x0,ppStack_28);
      if (new_size._4_4_ == 1) {
        iVar3 = inflateReset(&_prefix_size_local->zstream);
        if (iVar3 == 0) {
          pVar1 = *ppStack_28;
          size = (png_uint_32)newlength_local + pVar1 + (long)(int)(uint)(limit._4_4_ != 0);
          old_ptr = (png_bytep)png_malloc_base(_prefix_size_local,size);
          if (old_ptr == (png_bytep)0x0) {
            new_size._4_4_ = -4;
            png_zstream_error(_prefix_size_local,-4);
          }
          else {
            memset(old_ptr,0,size);
            new_size._4_4_ =
                 png_inflate(_prefix_size_local,_prefix_size_local->chunk_name,1,
                             _prefix_size_local->read_buffer + (png_uint_32)newlength_local,
                             (png_uint_32p)&new_size,old_ptr + (png_uint_32)newlength_local,
                             ppStack_28);
            if (new_size._4_4_ == 1) {
              if (pVar1 == *ppStack_28) {
                if (limit._4_4_ != 0) {
                  old_ptr[(ulong)(png_uint_32)newlength_local + *ppStack_28] = '\0';
                }
                if ((png_uint_32)newlength_local != 0) {
                  memcpy(old_ptr,_prefix_size_local->read_buffer,(ulong)(png_uint_32)newlength_local
                        );
                }
                ppVar2 = _prefix_size_local->read_buffer;
                _prefix_size_local->read_buffer = old_ptr;
                _prefix_size_local->read_buffer_size = size;
                old_ptr = ppVar2;
              }
              else {
                new_size._4_4_ = -7;
              }
            }
            else if (new_size._4_4_ == 0) {
              new_size._4_4_ = -7;
            }
            png_free(_prefix_size_local,old_ptr);
            if ((new_size._4_4_ == 1) &&
               (newlength_local._4_4_ - (png_uint_32)newlength_local != (int)new_size)) {
              png_chunk_benign_error(_prefix_size_local,"extra compressed data");
            }
          }
        }
        else {
          png_zstream_error(_prefix_size_local,new_size._4_4_);
          new_size._4_4_ = -7;
        }
      }
      else if (new_size._4_4_ == 0) {
        new_size._4_4_ = -7;
      }
      _prefix_size_local->zowner = 0;
    }
    else if (new_size._4_4_ == 1) {
      new_size._4_4_ = -7;
    }
    png_ptr_local._4_4_ = new_size._4_4_;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
png_decompress_chunk(png_structrp png_ptr,
    png_uint_32 chunklength, png_uint_32 prefix_size,
    png_alloc_size_t *newlength /* must be initialized to the maximum! */,
    int terminate /*add a '\0' to the end of the uncompressed data*/)
{
   /* TODO: implement different limits for different types of chunk.
    *
    * The caller supplies *newlength set to the maximum length of the
    * uncompressed data, but this routine allocates space for the prefix and
    * maybe a '\0' terminator too.  We have to assume that 'prefix_size' is
    * limited only by the maximum chunk size.
    */
   png_alloc_size_t limit = PNG_SIZE_MAX;

# ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;
# elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
# endif

   if (limit >= prefix_size + (terminate != 0))
   {
      int ret;

      limit -= prefix_size + (terminate != 0);

      if (limit < *newlength)
         *newlength = limit;

      /* Now try to claim the stream. */
      ret = png_inflate_claim(png_ptr, png_ptr->chunk_name);

      if (ret == Z_OK)
      {
         png_uint_32 lzsize = chunklength - prefix_size;

         ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
             /* input: */ png_ptr->read_buffer + prefix_size, &lzsize,
             /* output: */ NULL, newlength);

         if (ret == Z_STREAM_END)
         {
            /* Use 'inflateReset' here, not 'inflateReset2' because this
             * preserves the previously decided window size (otherwise it would
             * be necessary to store the previous window size.)  In practice
             * this doesn't matter anyway, because png_inflate will call inflate
             * with Z_FINISH in almost all cases, so the window will not be
             * maintained.
             */
            if (inflateReset(&png_ptr->zstream) == Z_OK)
            {
               /* Because of the limit checks above we know that the new,
                * expanded, size will fit in a size_t (let alone an
                * png_alloc_size_t).  Use png_malloc_base here to avoid an
                * extra OOM message.
                */
               png_alloc_size_t new_size = *newlength;
               png_alloc_size_t buffer_size = prefix_size + new_size +
                   (terminate != 0);
               png_bytep text = png_voidcast(png_bytep, png_malloc_base(png_ptr,
                   buffer_size));

               if (text != NULL)
               {
                  memset(text, 0, buffer_size);

                  ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
                      png_ptr->read_buffer + prefix_size, &lzsize,
                      text + prefix_size, newlength);

                  if (ret == Z_STREAM_END)
                  {
                     if (new_size == *newlength)
                     {
                        if (terminate != 0)
                           text[prefix_size + *newlength] = 0;

                        if (prefix_size > 0)
                           memcpy(text, png_ptr->read_buffer, prefix_size);

                        {
                           png_bytep old_ptr = png_ptr->read_buffer;

                           png_ptr->read_buffer = text;
                           png_ptr->read_buffer_size = buffer_size;
                           text = old_ptr; /* freed below */
                        }
                     }

                     else
                     {
                        /* The size changed on the second read, there can be no
                         * guarantee that anything is correct at this point.
                         * The 'msg' pointer has been set to "unexpected end of
                         * LZ stream", which is fine, but return an error code
                         * that the caller won't accept.
                         */
                        ret = PNG_UNEXPECTED_ZLIB_RETURN;
                     }
                  }

                  else if (ret == Z_OK)
                     ret = PNG_UNEXPECTED_ZLIB_RETURN; /* for safety */

                  /* Free the text pointer (this is the old read_buffer on
                   * success)
                   */
                  png_free(png_ptr, text);

                  /* This really is very benign, but it's still an error because
                   * the extra space may otherwise be used as a Trojan Horse.
                   */
                  if (ret == Z_STREAM_END &&
                      chunklength - prefix_size != lzsize)
                     png_chunk_benign_error(png_ptr, "extra compressed data");
               }

               else
               {
                  /* Out of memory allocating the buffer */
                  ret = Z_MEM_ERROR;
                  png_zstream_error(png_ptr, Z_MEM_ERROR);
               }
            }

            else
            {
               /* inflateReset failed, store the error message */
               png_zstream_error(png_ptr, ret);
               ret = PNG_UNEXPECTED_ZLIB_RETURN;
            }
         }

         else if (ret == Z_OK)
            ret = PNG_UNEXPECTED_ZLIB_RETURN;

         /* Release the claimed stream */
         png_ptr->zowner = 0;
      }

      else /* the claim failed */ if (ret == Z_STREAM_END) /* impossible! */
         ret = PNG_UNEXPECTED_ZLIB_RETURN;

      return ret;
   }

   else
   {
      /* Application/configuration limits exceeded */
      png_zstream_error(png_ptr, Z_MEM_ERROR);
      return Z_MEM_ERROR;
   }
}